

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testPartHelper.cpp
# Opt level: O0

void (anonymous_namespace)::print<Imf_2_5::MultiViewChannelName*>
               (MultiViewChannelName **begin,MultiViewChannelName **end)

{
  int *piVar1;
  ostream *poVar2;
  long *in_RSI;
  long *in_RDI;
  MultiViewChannelName *i_1;
  int p;
  MultiViewChannelName *i;
  int parts;
  long local_30;
  int local_24;
  long local_20;
  int local_14;
  long *local_10;
  long *local_8;
  
  local_14 = 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_20 = *in_RDI; local_20 != *local_10; local_20 = local_20 + 0x70) {
    piVar1 = std::max<int>((int *)(local_20 + 0x48),&local_14);
    local_14 = *piVar1;
  }
  for (local_24 = 0; local_24 < local_14; local_24 = local_24 + 1) {
    for (local_30 = *local_8; local_30 != *local_10; local_30 = local_30 + 0x70) {
      if (*(int *)(local_30 + 0x48) == local_24) {
        poVar2 = (ostream *)std::ostream::operator<<(&std::cout,*(int *)(local_30 + 0x48));
        poVar2 = std::operator<<(poVar2,' ');
        poVar2 = std::operator<<(poVar2,(string *)(local_30 + 8));
        poVar2 = std::operator<<(poVar2," in ");
        poVar2 = std::operator<<(poVar2,(string *)(local_30 + 0x28));
        poVar2 = std::operator<<(poVar2,' ');
        poVar2 = std::operator<<(poVar2,' ');
        poVar2 = std::operator<<(poVar2,(string *)(local_30 + 0x50));
        std::operator<<(poVar2,"\n");
      }
    }
  }
  return;
}

Assistant:

void
print(const T & begin,const T & end)
{
    int parts=1;
    for(T i=begin;i!=end;i++)
    {
        parts=max(i->part_number,parts);
    }

    for(int p=0;p<parts;p++)
    {
        for(T i=begin;i!=end;i++)
        {
            if(i->part_number==p)
            {
                cout << i->part_number << ' ' << i->name << " in " << i->view
                     << ' ' << ' ' << i->internal_name << "\n";
            }
        }
    }
}